

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async_bio.cc
# Opt level: O0

int anon_unknown.dwarf_2b::AsyncRead(BIO *bio,char *out,int outl)

{
  AsyncBio *pAVar1;
  BIO *b;
  int *piVar2;
  int local_40;
  int ret;
  BIO *next;
  AsyncBio *a;
  int outl_local;
  char *out_local;
  BIO *bio_local;
  
  pAVar1 = GetData(bio);
  b = BIO_next((BIO *)bio);
  if ((pAVar1 == (AsyncBio *)0x0) || (b == (BIO *)0x0)) {
    bio_local._4_4_ = 0;
  }
  else {
    BIO_clear_retry_flags(bio);
    if (pAVar1->read_quota == 0) {
      BIO_set_retry_read(bio);
      piVar2 = __errno_location();
      *piVar2 = 0xb;
      bio_local._4_4_ = -1;
    }
    else {
      a._4_4_ = outl;
      if (((pAVar1->datagram & 1U) == 0) && (pAVar1->read_quota < (ulong)(long)outl)) {
        a._4_4_ = (int)pAVar1->read_quota;
      }
      bio_local._4_4_ = BIO_read(b,out,a._4_4_);
      if (bio_local._4_4_ < 1) {
        BIO_copy_next_retry((BIO *)bio);
      }
      else {
        local_40 = bio_local._4_4_;
        if ((pAVar1->datagram & 1U) != 0) {
          local_40 = 1;
        }
        pAVar1->read_quota = pAVar1->read_quota - (long)local_40;
      }
    }
  }
  return bio_local._4_4_;
}

Assistant:

static int AsyncRead(BIO *bio, char *out, int outl) {
  AsyncBio *a = GetData(bio);
  BIO *next = BIO_next(bio);
  if (a == nullptr || next == nullptr) {
    return 0;
  }

  BIO_clear_retry_flags(bio);

  if (a->read_quota == 0) {
    BIO_set_retry_read(bio);
    errno = EAGAIN;
    return -1;
  }

  if (!a->datagram && static_cast<size_t>(outl) > a->read_quota) {
    outl = static_cast<int>(a->read_quota);
  }
  int ret = BIO_read(next, out, outl);
  if (ret <= 0) {
    BIO_copy_next_retry(bio);
  } else {
    a->read_quota -= (a->datagram ? 1 : ret);
  }
  return ret;
}